

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedSlowWithCopy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this,Type *value,Arena *value_arena,Arena *my_arena)

{
  Type *new_value;
  Arena *my_arena_local;
  Arena *value_arena_local;
  Type *value_local;
  RepeatedPtrFieldBase *this_local;
  
  value_arena_local = (Arena *)value;
  if ((my_arena == (Arena *)0x0) || (value_arena != (Arena *)0x0)) {
    if (my_arena != value_arena) {
      value_arena_local =
           (Arena *)GenericTypeHandler<google::protobuf::Message>::NewFromPrototype(value,my_arena);
      GenericTypeHandler<google::protobuf::Message>::Merge(value,(Message *)value_arena_local);
      GenericTypeHandler<google::protobuf::Message>::Delete(value,value_arena);
    }
  }
  else if (value != (Type *)0x0) {
    ThreadSafeArena::AddCleanup
              ((ThreadSafeArena *)my_arena,value,arena_delete_object<google::protobuf::MessageLite>)
    ;
  }
  UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            (this,(Type *)value_arena_local);
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocatedSlowWithCopy(
    // Pass value_arena and my_arena to avoid duplicate virtual call (value) or
    // load (mine).
    typename TypeHandler::Type* value, Arena* value_arena, Arena* my_arena) {
  // Ensure that either the value is in the same arena, or if not, we do the
  // appropriate thing: Own() it (if it's on heap and we're in an arena) or copy
  // it to our arena/heap (otherwise).
  if (my_arena != nullptr && value_arena == nullptr) {
    my_arena->Own(value);
  } else if (my_arena != value_arena) {
    typename TypeHandler::Type* new_value =
        TypeHandler::NewFromPrototype(value, my_arena);
    TypeHandler::Merge(*value, new_value);
    TypeHandler::Delete(value, value_arena);
    value = new_value;
  }

  UnsafeArenaAddAllocated<TypeHandler>(value);
}